

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

unsigned_long
testing::internal::anon_unknown_31::ReadProcFileField<unsigned_long>(string *filename,int field)

{
  ulong uVar1;
  char *pcVar2;
  int in_ESI;
  unsigned_long output;
  ifstream file;
  string dummy;
  ulong local_250 [3];
  istream local_238 [520];
  string local_30 [36];
  int local_c;
  
  local_c = in_ESI;
  std::__cxx11::string::string(local_30);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_238,pcVar2,_S_in);
  while (0 < local_c) {
    local_c = local_c + -1;
    std::operator>>(local_238,local_30);
  }
  local_250[0] = 0;
  local_c = local_c + -1;
  std::istream::operator>>(local_238,local_250);
  uVar1 = local_250[0];
  std::ifstream::~ifstream(local_238);
  std::__cxx11::string::~string(local_30);
  return uVar1;
}

Assistant:

T ReadProcFileField(const std::string& filename, int field) {
  std::string dummy;
  std::ifstream file(filename.c_str());
  while (field-- > 0) {
    file >> dummy;
  }
  T output = 0;
  file >> output;
  return output;
}